

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> __thiscall Catch::list(Catch *this,shared_ptr<Catch::Config> *config)

{
  bool bVar1;
  IMutableContext *pIVar2;
  element_type *peVar3;
  unsigned_long uVar4;
  size_t sVar5;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char acVar6 [8];
  Option<unsigned_long> OVar7;
  unsigned_long local_80;
  unsigned_long local_78 [3];
  unsigned_long local_60;
  unsigned_long local_58 [3];
  shared_ptr<const_Catch::IConfig> local_40 [2];
  undefined1 local_19;
  __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<Catch::Config> *config_local;
  Option<unsigned_long> *listedCount;
  
  local_19 = 0;
  local_18 = (__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)config;
  config_local = (shared_ptr<Catch::Config> *)this;
  Option<unsigned_long>::Option((Option<unsigned_long> *)this);
  pIVar2 = getCurrentMutableContext();
  std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
            ((shared_ptr<Catch::IConfig_const> *)local_40,(shared_ptr<Catch::Config> *)local_18);
  (*(pIVar2->super_IContext)._vptr_IContext[7])(pIVar2,(shared_ptr<Catch::IConfig_const> *)local_40)
  ;
  std::shared_ptr<const_Catch::IConfig>::~shared_ptr(local_40);
  peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  bVar1 = Config::listTests(peVar3);
  if (bVar1) {
    local_58[1] = 0;
    uVar4 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,local_58 + 1);
    peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(local_18);
    sVar5 = listTests(peVar3);
    local_58[2] = uVar4 + sVar5;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_58 + 2);
  }
  peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  bVar1 = Config::listTestNamesOnly(peVar3);
  if (bVar1) {
    local_60 = 0;
    uVar4 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,&local_60);
    peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(local_18);
    sVar5 = listTestsNamesOnly(peVar3);
    local_58[0] = uVar4 + sVar5;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_58);
  }
  peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  bVar1 = Config::listTags(peVar3);
  if (bVar1) {
    local_78[1] = 0;
    uVar4 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,local_78 + 1);
    peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(local_18);
    sVar5 = listTags(peVar3);
    local_78[2] = uVar4 + sVar5;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_78 + 2);
  }
  peVar3 = std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_18);
  bVar1 = Config::listReporters(peVar3);
  acVar6 = extraout_RDX;
  if (bVar1) {
    local_80 = 0;
    uVar4 = Option<unsigned_long>::valueOr((Option<unsigned_long> *)this,&local_80);
    sVar5 = listReporters();
    local_78[0] = uVar4 + sVar5;
    Option<unsigned_long>::operator=((Option<unsigned_long> *)this,local_78);
    acVar6 = extraout_RDX_00;
  }
  OVar7.storage[0] = acVar6[0];
  OVar7.storage[1] = acVar6[1];
  OVar7.storage[2] = acVar6[2];
  OVar7.storage[3] = acVar6[3];
  OVar7.storage[4] = acVar6[4];
  OVar7.storage[5] = acVar6[5];
  OVar7.storage[6] = acVar6[6];
  OVar7.storage[7] = acVar6[7];
  OVar7.nullableValue = (unsigned_long *)this;
  return OVar7;
}

Assistant:

Option<std::size_t> list( std::shared_ptr<Config> const& config ) {
        Option<std::size_t> listedCount;
        getCurrentMutableContext().setConfig( config );
        if( config->listTests() )
            listedCount = listedCount.valueOr(0) + listTests( *config );
        if( config->listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( *config );
        if( config->listTags() )
            listedCount = listedCount.valueOr(0) + listTags( *config );
        if( config->listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters();
        return listedCount;
    }